

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestRootNodes::Run(GraphTestRootNodes *this)

{
  int iVar1;
  Test *this_00;
  bool condition;
  State *state;
  ulong uVar2;
  vector<Node_*,_std::allocator<Node_*>_> root_nodes;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string name;
  
  iVar1 = g_current_test->assertion_failures_;
  state = &(this->super_GraphTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "build out1: cat in1\nbuild mid1: cat in1\nbuild out2: cat mid1\nbuild out3 out4: cat mid1\n"
              ,(ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    State::RootNodes(&root_nodes,state,&err);
    testing::Test::Check
              (g_current_test,
               (long)root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0xd3,"4u == root_nodes.size()");
    for (uVar2 = 0;
        uVar2 < (ulong)((long)root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                        (long)root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                              .super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      std::__cxx11::string::string
                ((string *)&name,
                 (string *)
                 root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2]);
      this_00 = g_current_test;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&name);
      condition = std::operator==("out",&local_70);
      testing::Test::Check
                (this_00,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0xd6,"\"out\" == name.substr(0, 3)");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&name);
    }
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              (&root_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
    std::__cxx11::string::~string((string *)&err);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, RootNodes) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out1: cat in1\n"
"build mid1: cat in1\n"
"build out2: cat mid1\n"
"build out3 out4: cat mid1\n"));

  string err;
  vector<Node*> root_nodes = state_.RootNodes(&err);
  EXPECT_EQ(4u, root_nodes.size());
  for (size_t i = 0; i < root_nodes.size(); ++i) {
    string name = root_nodes[i]->path();
    EXPECT_EQ("out", name.substr(0, 3));
  }
}